

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCNSeq.cpp
# Opt level: O2

void __thiscall OpenMD::GCNSeq::doFrame(GCNSeq *this,int istep)

{
  SelectionManager *this_00;
  SimInfo *pSVar1;
  pointer piVar2;
  int iVar3;
  reference pvVar4;
  StuntDouble *pSVar5;
  uint *puVar6;
  ulong uVar7;
  ostream *poVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double local_288;
  int iterator1;
  SelectionManager *local_278;
  int local_270;
  int iterator2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  listNN;
  vector<int,_std::allocator<int>_> globalToLocal;
  Vector<double,_3U> local_228;
  Vector3d pos1;
  Vector3d diff;
  Vector3d pos2;
  vector<double,_std::allocator<double>_> histo;
  SelectionManager common;
  
  local_270 = istep;
  SelectionManager::SelectionManager(&common,(this->super_SequentialAnalyzer).info_);
  listNN.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  listNN.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  listNN.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  globalToLocal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  globalToLocal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  globalToLocal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Vector<double,_3U>::Vector(&pos1.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&pos2.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&diff.super_Vector<double,_3U>);
  local_278 = &(this->super_SequentialAnalyzer).seleMan1_;
  iVar3 = SelectionManager::getSelectionCount(local_278);
  this->selectionCount1_ = iVar3;
  this_00 = &(this->super_SequentialAnalyzer).seleMan2_;
  iVar3 = SelectionManager::getSelectionCount(this_00);
  this->selectionCount2_ = iVar3;
  operator|((SelectionManager *)&histo,local_278,this_00);
  SelectionManager::operator=(&common,(SelectionManager *)&histo);
  SelectionManager::~SelectionManager((SelectionManager *)&histo);
  iVar3 = OpenMDBitSet::countBits
                    (common.ss_.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (globalToLocal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      globalToLocal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    globalToLocal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = globalToLocal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  pSVar1 = (this->super_SequentialAnalyzer).info_;
  histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT44(histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::resize
            (&globalToLocal,(long)pSVar1->nGlobalRigidBodies_ + (long)pSVar1->nGlobalAtoms_,
             (value_type_conflict2 *)&histo);
  for (uVar11 = 0;
      (ulong)uVar11 <
      (ulong)(((long)listNN.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)listNN.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar11 = uVar11 + 1) {
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::at(&listNN,(ulong)uVar11);
    piVar2 = (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if ((pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar2) {
      (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar2;
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(&listNN);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&listNN,(long)iVar3);
  histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_228.data_[0] = 0.0;
  std::vector<double,_std::allocator<double>_>::resize(&histo,(long)this->bins_,local_228.data_);
  pSVar5 = SelectionManager::beginSelected(&common,&iterator1);
  uVar11 = 0;
  while (pSVar5 != (StuntDouble *)0x0) {
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::at
                               (&globalToLocal,(long)pSVar5->globalIndex_);
    *puVar6 = uVar11;
    StuntDouble::getPos((Vector3d *)&local_228,pSVar5);
    Vector<double,_3U>::operator=(&pos1.super_Vector<double,_3U>,&local_228);
    pSVar5 = SelectionManager::beginSelected(&common,&iterator2);
    uVar12 = 0;
    while (pSVar5 != (StuntDouble *)0x0) {
      if (uVar11 < uVar12) {
        StuntDouble::getPos((Vector3d *)&local_228,pSVar5);
        Vector<double,_3U>::operator=(&pos2.super_Vector<double,_3U>,&local_228);
        operator-(&local_228,&pos2.super_Vector<double,_3U>,&pos1.super_Vector<double,_3U>);
        Vector3<double>::operator=((Vector3<double> *)&diff.super_Vector<double,_3U>,&local_228);
        if (this->usePBC_ == true) {
          Snapshot::wrapVector
                    ((this->super_SequentialAnalyzer).currentSnapshot_,
                     (Vector3d *)&diff.super_Vector<double,_3U>);
        }
        dVar13 = Vector<double,_3U>::length(&diff.super_Vector<double,_3U>);
        if (dVar13 < this->rCut_) {
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::at(&listNN,(ulong)uVar11);
          local_228.data_[0]._0_4_ = uVar12;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar4,(int *)&local_228);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::at(&listNN,(ulong)uVar12);
          local_228.data_[0] = (double)CONCAT44(local_228.data_[0]._4_4_,uVar11);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar4,(int *)&local_228);
        }
      }
      pSVar5 = SelectionManager::nextSelected(&common,&iterator2);
      uVar12 = uVar12 + 1;
    }
    pSVar5 = SelectionManager::nextSelected(&common,&iterator1);
    uVar11 = uVar11 + 1;
  }
  pSVar5 = SelectionManager::beginSelected(local_278,&iterator1);
  while (pSVar5 != (StuntDouble *)0x0) {
    puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::at
                               (&globalToLocal,(long)pSVar5->globalIndex_);
    uVar11 = *puVar6;
    uVar12 = 0;
    local_288 = 0.0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&listNN,(ulong)uVar11);
      if ((ulong)((long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= (ulong)uVar12) break;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&listNN,(ulong)uVar11);
      puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::at(pvVar4,(ulong)uVar12);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&listNN,(ulong)*puVar6);
      lVar9 = (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar10 = lVar9 >> 2;
      auVar14._8_4_ = (int)(lVar9 >> 0x22);
      auVar14._0_8_ = lVar10;
      auVar14._12_4_ = 0x45300000;
      local_288 = local_288 +
                  (auVar14._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
      uVar12 = uVar12 + 1;
    }
    local_288 = local_288 / (double)this->nnMax_;
    uVar7 = (ulong)(uint)(int)(local_288 / this->delta_);
    if (uVar7 < (ulong)((long)histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3)) {
      histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar7] =
           histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start[uVar7] + 1.0;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"In frame ");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_270);
      poVar8 = std::operator<<(poVar8,", object ");
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,pSVar5->globalIndex_);
      std::operator<<(poVar8," has GCN value = ");
      poVar8 = std::ostream::_M_insert<double>(local_288);
      std::operator<<(poVar8,"\n");
    }
    pSVar5 = SelectionManager::nextSelected(local_278,&iterator1);
  }
  iVar3 = this->selectionCount1_;
  for (uVar11 = 0; uVar7 = (ulong)uVar11,
      uVar7 < (ulong)((long)histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar11 = uVar11 + 1) {
    if (iVar3 < 1) {
      dVar13 = 0.0;
    }
    else {
      dVar13 = histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7] / (double)iVar3;
    }
    histo.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar7] = dVar13;
  }
  std::vector<int,_std::allocator<int>_>::push_back(&this->count_,&this->selectionCount1_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->histogram_,&histo);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&histo.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&globalToLocal.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&listNN);
  SelectionManager::~SelectionManager(&common);
  return;
}

Assistant:

void GCNSeq::doFrame(int istep) {
    SelectionManager common(info_);

    std::vector<std::vector<int>> listNN;
    std::vector<int> globalToLocal;

    StuntDouble* sd1;
    StuntDouble* sd2;

    int iterator1;
    int iterator2;
    unsigned int mapIndex1(0);
    unsigned int mapIndex2(0);
    unsigned int tempIndex(0);
    unsigned int whichBin(0);
    RealType gcn(0.0);
    Vector3d pos1;
    Vector3d pos2;
    Vector3d diff;
    RealType distance;

    // First have to calculate lists of nearest neighbors (listNN_):

    selectionCount1_ = seleMan1_.getSelectionCount();
    selectionCount2_ = seleMan2_.getSelectionCount();

    // We need a common selection set:
    common          = seleMan1_ | seleMan2_;
    int commonCount = common.getSelectionCount();

    globalToLocal.clear();
    globalToLocal.resize(
        info_->getNGlobalAtoms() + info_->getNGlobalRigidBodies(), -1);
    for (unsigned int i = 0; i < listNN.size(); i++)
      listNN.at(i).clear();
    listNN.clear();
    listNN.resize(commonCount);
    std::vector<RealType> histo;
    histo.resize(bins_, 0.0);

    mapIndex1 = 0;
    for (sd1 = common.beginSelected(iterator1); sd1 != NULL;
         sd1 = common.nextSelected(iterator1)) {
      globalToLocal.at(sd1->getGlobalIndex()) = mapIndex1;

      pos1 = sd1->getPos();

      mapIndex2 = 0;
      for (sd2 = common.beginSelected(iterator2); sd2 != NULL;
           sd2 = common.nextSelected(iterator2)) {
        if (mapIndex1 < mapIndex2) {
          pos2 = sd2->getPos();
          diff = pos2 - pos1;
          if (usePBC_) currentSnapshot_->wrapVector(diff);
          distance = diff.length();
          if (distance < rCut_) {
            listNN.at(mapIndex1).push_back(mapIndex2);
            listNN.at(mapIndex2).push_back(mapIndex1);
          }
        }
        mapIndex2++;
      }
      mapIndex1++;
    }

    // Fill up the histogram with gcn values
    for (sd1 = seleMan1_.beginSelected(iterator1); sd1 != NULL;
         sd1 = seleMan1_.nextSelected(iterator1)) {
      mapIndex1 = globalToLocal.at(sd1->getGlobalIndex());
      gcn       = 0.0;
      for (unsigned int i = 0; i < listNN.at(mapIndex1).size(); i++) {
        // tempIndex is the index of one of i's nearest neighbors
        tempIndex = listNN.at(mapIndex1).at(i);
        gcn += listNN.at(tempIndex).size();
      }

      gcn      = gcn / nnMax_;
      whichBin = int(gcn / delta_);
      if (whichBin < histo.size()) {
        histo[whichBin] += 1;
      } else {
        cerr << "In frame " << istep << ", object " << sd1->getGlobalIndex()
             << " has GCN value = " << gcn << "\n";
      }
    }

    for (unsigned int n = 0; n < histo.size(); n++) {
      if (selectionCount1_ > 0)
        histo[n] /= RealType(selectionCount1_);
      else
        histo[n] = 0.0;
    }

    count_.push_back(selectionCount1_);
    histogram_.push_back(histo);
  }